

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O0

void RDL_checkDependencies(RDL_cfURF *RCFs,RDL_graph *graph,RDL_URFinfo *uInfo)

{
  uint uVar1;
  uint uVar2;
  uchar uVar3;
  uint uVar4;
  int iVar5;
  uint nof_rows;
  uint uVar6;
  uchar **rows;
  uchar **rows_00;
  uchar **rows_01;
  void *__ptr;
  uchar *empty_cycle_00;
  uchar *cycle;
  uchar *cycle_00;
  uchar *empty_cycle;
  uchar **compressedPrototypesForGaussian;
  uchar *compressedCycleWithEqualAdded;
  uchar *compressedCycleWithSmallerAdded;
  uint *relevantCyclesMap;
  uint currentRelevantCyclesSmallerEnd;
  uint currentRelevantCyclesSize;
  uchar **compressedRelevantCycles;
  uint compressedSize;
  uint oldBasisCyclesSize;
  uint currentBasisCyclesSmallerEnd;
  uint currentBasisCyclesSize;
  uint maxBasisCyclesSize;
  uchar **compressedBasisCycles;
  uint index;
  uint k;
  uint j;
  uint i;
  RDL_URFinfo *uInfo_local;
  RDL_graph *graph_local;
  RDL_cfURF *RCFs_local;
  
  oldBasisCyclesSize = 0;
  compressedRelevantCycles._4_4_ = 0;
  relevantCyclesMap._4_4_ = 0;
  if (RCFs->nofFams < 3) {
    for (k = 0; k < uInfo->nofWeights; k = k + 1) {
      for (index = 0; index < uInfo->nofProtos[k]; index = index + 1) {
        uInfo->URFrel[k][index][index] = '\x01';
      }
    }
    for (k = 0; k < RCFs->nofFams; k = k + 1) {
      RCFs->fams[k]->mark = 1;
    }
  }
  else {
    rows = (uchar **)malloc((ulong)((graph->E - graph->V) + 1) << 3);
    rows_00 = (uchar **)malloc((ulong)RCFs->nofFams << 3);
    rows_01 = (uchar **)malloc((ulong)RCFs->nofFams << 3);
    __ptr = malloc((ulong)RCFs->nofFams << 2);
    for (k = 0; k < RCFs->nofFams; k = k + 1) {
      compressedRelevantCycles._4_4_ =
           RDL_bitset_compressed(rows_00 + k,RCFs->fams[k]->prototype,graph->E);
    }
    empty_cycle_00 = (uchar *)malloc((ulong)compressedRelevantCycles._4_4_);
    memset(empty_cycle_00,0,(ulong)compressedRelevantCycles._4_4_);
    for (k = 0; uVar2 = oldBasisCyclesSize, uVar1 = relevantCyclesMap._4_4_, k < uInfo->nofWeights;
        k = k + 1) {
      for (index = 0; index < uInfo->nofProtos[k]; index = index + 1) {
        uVar4 = RDL_idxWeights(uInfo,k,index);
        cycle = (uchar *)malloc((ulong)compressedRelevantCycles._4_4_);
        memcpy(cycle,rows_00[uVar4],(ulong)compressedRelevantCycles._4_4_);
        for (compressedBasisCycles._4_4_ = 0; compressedBasisCycles._4_4_ < uVar2;
            compressedBasisCycles._4_4_ = compressedBasisCycles._4_4_ + 1) {
          uVar3 = RDL_bitset_test(cycle,compressedBasisCycles._4_4_);
          if (uVar3 != '\0') {
            RDL_bitset_xor_inplace
                      (cycle,rows[compressedBasisCycles._4_4_],compressedRelevantCycles._4_4_);
          }
        }
        iVar5 = RDL_bitset_empty(cycle,empty_cycle_00,compressedRelevantCycles._4_4_);
        uVar6 = oldBasisCyclesSize;
        if (iVar5 == 0) {
          rows_01[relevantCyclesMap._4_4_] = cycle;
          *(uint *)((long)__ptr + (ulong)relevantCyclesMap._4_4_ * 4) = index;
          nof_rows = relevantCyclesMap._4_4_ + 1;
          RCFs->fams[uVar4]->mark = 1;
          uInfo->URFrel[k][index][index] = '\x01';
          cycle_00 = (uchar *)malloc((ulong)compressedRelevantCycles._4_4_);
          memcpy(cycle_00,cycle,(ulong)compressedRelevantCycles._4_4_);
          for (compressedBasisCycles._4_4_ = uVar2; compressedBasisCycles._4_4_ < oldBasisCyclesSize
              ; compressedBasisCycles._4_4_ = compressedBasisCycles._4_4_ + 1) {
            uVar3 = RDL_bitset_test(cycle_00,compressedBasisCycles._4_4_);
            if (uVar3 != '\0') {
              RDL_bitset_xor_inplace
                        (cycle_00,rows[compressedBasisCycles._4_4_],compressedRelevantCycles._4_4_);
            }
          }
          iVar5 = RDL_bitset_empty(cycle_00,empty_cycle_00,compressedRelevantCycles._4_4_);
          if (iVar5 == 0) {
            rows[oldBasisCyclesSize] = cycle_00;
            uVar6 = oldBasisCyclesSize + 1;
            uVar3 = RDL_bitset_test(cycle_00,oldBasisCyclesSize);
            relevantCyclesMap._4_4_ = nof_rows;
            compressedBasisCycles._4_4_ = oldBasisCyclesSize;
            if (uVar3 == '\0') {
              do {
                compressedBasisCycles._4_4_ = compressedBasisCycles._4_4_ + 1;
                if (graph->E <= compressedBasisCycles._4_4_) goto LAB_0011143d;
                uVar3 = RDL_bitset_test(cycle_00,compressedBasisCycles._4_4_);
              } while (uVar3 == '\0');
              RDL_swap_columns(rows,uVar6,oldBasisCyclesSize,compressedBasisCycles._4_4_);
              RDL_swap_columns(rows_01,nof_rows,oldBasisCyclesSize,compressedBasisCycles._4_4_);
              RDL_swap_columns(rows_00,RCFs->nofFams,oldBasisCyclesSize,compressedBasisCycles._4_4_)
              ;
            }
          }
          else {
            for (compressedBasisCycles._4_4_ = uVar1;
                compressedBasisCycles._4_4_ < relevantCyclesMap._4_4_;
                compressedBasisCycles._4_4_ = compressedBasisCycles._4_4_ + 1) {
              memcpy(cycle_00,cycle,(ulong)compressedRelevantCycles._4_4_);
              RDL_bitset_xor_inplace
                        (cycle_00,rows_01[compressedBasisCycles._4_4_],
                         compressedRelevantCycles._4_4_);
              iVar5 = RDL_bitset_empty(cycle_00,empty_cycle_00,compressedRelevantCycles._4_4_);
              if (iVar5 != 0) {
                uInfo->URFrel[k][index]
                [*(uint *)((long)__ptr + (ulong)compressedBasisCycles._4_4_ * 4)] = '\x01';
                uInfo->URFrel[k][*(uint *)((long)__ptr + (ulong)compressedBasisCycles._4_4_ * 4)]
                [index] = '\x01';
              }
            }
            free(cycle_00);
            relevantCyclesMap._4_4_ = nof_rows;
          }
        }
        else {
          free(cycle);
        }
LAB_0011143d:
        oldBasisCyclesSize = uVar6;
      }
    }
    for (k = 0; k < oldBasisCyclesSize; k = k + 1) {
      free(rows[k]);
    }
    free(rows);
    for (k = 0; k < relevantCyclesMap._4_4_; k = k + 1) {
      free(rows_01[k]);
    }
    free(rows_01);
    free(__ptr);
    for (k = 0; k < RCFs->nofFams; k = k + 1) {
      free(rows_00[k]);
    }
    free(rows_00);
    free(empty_cycle_00);
  }
  return;
}

Assistant:

void RDL_checkDependencies(RDL_cfURF *RCFs, RDL_graph *graph, RDL_URFinfo *uInfo)
{
  unsigned i,j,k, index;

  /* this array contains the basis cycles in row echelon form */
  unsigned char **compressedBasisCycles;
  unsigned maxBasisCyclesSize = graph->E - graph->V + 1;
  unsigned currentBasisCyclesSize = 0;
  unsigned currentBasisCyclesSmallerEnd = 0;
  unsigned oldBasisCyclesSize;
  unsigned compressedSize = 0;

  unsigned char **compressedRelevantCycles;
  unsigned currentRelevantCyclesSize = 0;
  unsigned currentRelevantCyclesSmallerEnd = 0;
  unsigned *relevantCyclesMap;

  unsigned char *compressedCycleWithSmallerAdded;
  unsigned char *compressedCycleWithEqualAdded;
  unsigned char **compressedPrototypesForGaussian;

  const unsigned char* empty_cycle;

  if(RCFs->nofFams < 3) {
    /*if only 0, 1 or 2 families exist, they are all relevant and independent*/
    for(i=0; i<uInfo->nofWeights; ++i) {
      for(j=0; j<uInfo->nofProtos[i]; ++j) {
        uInfo->URFrel[i][j][j] = 1; /*URF-related to itself*/
      }
    }
    for(i=0; i<RCFs->nofFams; ++i) {
      RCFs->fams[i]->mark = 1;
    }
    return;
  }

  compressedBasisCycles = malloc(maxBasisCyclesSize * sizeof(*compressedBasisCycles));
  compressedPrototypesForGaussian = malloc(RCFs->nofFams * sizeof(*compressedPrototypesForGaussian));
  compressedRelevantCycles = malloc(RCFs->nofFams * sizeof(*compressedRelevantCycles));
  relevantCyclesMap = malloc(RCFs->nofFams * sizeof(*relevantCyclesMap));

  /* copy the prototypes for gaussian elimination */
  for (i = 0; i < RCFs->nofFams; ++i) {
    compressedSize = RDL_bitset_compressed(
        &(compressedPrototypesForGaussian[i]), RCFs->fams[i]->prototype, graph->E);
  }
  empty_cycle = malloc(compressedSize * sizeof(*empty_cycle));
  memset((unsigned char*)empty_cycle, 0, compressedSize * sizeof(*empty_cycle));
  /* printf("%d %d\n", compressedSize, graph->E); */

  /* iterate over all weights */
  for (i = 0; i < uInfo->nofWeights; ++i) {
    /* reset indices indication the first index of larger cycles */
    currentBasisCyclesSmallerEnd = currentBasisCyclesSize;
    currentRelevantCyclesSmallerEnd = currentRelevantCyclesSize;
    for (j = 0; j < uInfo->nofProtos[i]; ++j) {

      index = RDL_idxWeights(uInfo, i, j);
      /* copy current cycle */
      compressedCycleWithSmallerAdded = malloc(compressedSize * sizeof(*compressedCycleWithSmallerAdded));
      memcpy(compressedCycleWithSmallerAdded, compressedPrototypesForGaussian[index],
          compressedSize * sizeof(*compressedCycleWithSmallerAdded));

      /*
       * add smaller cycles of the basis (set B<)
       *
       * the basisCycles are in row echelon form (see below), so we add each cycle that
       * has a 1 at position k (all smaller positions are 0, row echelon)
       *
       * [this corresponds to the "add row operation" of gaussian elimination]
       */
      for (k = 0; k < currentBasisCyclesSmallerEnd; ++k) {
        if (RDL_bitset_test(compressedCycleWithSmallerAdded, k)) {
          RDL_bitset_xor_inplace(compressedCycleWithSmallerAdded,
              compressedBasisCycles[k], compressedSize);
        }
      }

      /*
       * if the result is empty, then this cycle linearly depends
       * on smaller cycles of the basis B<
       *
       * => trivial
       * <= is also true because adding more smaller cycles can't make
       * the cycle 0 (how could it?)
       */
      if (RDL_bitset_empty(compressedCycleWithSmallerAdded, empty_cycle, compressedSize)) {
        free(compressedCycleWithSmallerAdded);
        continue;
      }

      /* this cycle does not depend on strictly smaller cycles => relevant */
      compressedRelevantCycles[currentRelevantCyclesSize] = compressedCycleWithSmallerAdded;
      relevantCyclesMap[currentRelevantCyclesSize] = j; /* this is no bug, we really need the "internal" index */
      ++currentRelevantCyclesSize;

      RCFs->fams[index]->mark = 1;
      uInfo->URFrel[i][j][j] = 1; /*URF-related to itself*/

      /* make a copy for adding the equal sized cycles */
      compressedCycleWithEqualAdded = malloc(compressedSize * sizeof(*compressedCycleWithEqualAdded));
      memcpy(compressedCycleWithEqualAdded, compressedCycleWithSmallerAdded,
          compressedSize * sizeof(*compressedCycleWithSmallerAdded));

      /*
       * add equal sized cycles of the basis (set B=)
       *
       * the same arguments as for the smaller cycles apply
       */
      for (k = currentBasisCyclesSmallerEnd; k < currentBasisCyclesSize; ++k) {
        if (RDL_bitset_test(compressedCycleWithEqualAdded, k)) {
          RDL_bitset_xor_inplace(compressedCycleWithEqualAdded,
              compressedBasisCycles[k], compressedSize);
        }
      }

      if (RDL_bitset_empty(compressedCycleWithEqualAdded, empty_cycle, compressedSize)) {
        /*
         * if the cycle depends linearly on any equal sized cycle of the
         * basis (B=), we check all RELEVANT cycles we've seen so far for
         * linear dependence
         *
         * (-1 because we don't have to add the ring to itself)
         */

        for (k = currentRelevantCyclesSmallerEnd; k < currentRelevantCyclesSize-1; ++k) {
          memcpy(compressedCycleWithEqualAdded, compressedCycleWithSmallerAdded,
              compressedSize * sizeof(*compressedCycleWithSmallerAdded));
          RDL_bitset_xor_inplace(compressedCycleWithEqualAdded,
              compressedRelevantCycles[k], compressedSize);
          if (RDL_bitset_empty(compressedCycleWithEqualAdded, empty_cycle, compressedSize)) {
            /*
             * if there is any equal sized cycle that is in fact equal to the current cycle
             * (after adding smaller cycles) => those cycles fulfill URF condition 1 (equal size)
             * and also condition 3 (depended on each other and smaller cycles)
             */
            uInfo->URFrel[i][j][relevantCyclesMap[k]] = 1;
            uInfo->URFrel[i][relevantCyclesMap[k]][j] = 1;
          }
        }

        free(compressedCycleWithEqualAdded);
      }
      else {
        /*
         * the current cycle is also independent of equal sized cycles,
         * so it's part of the basis, add it to B=
         *
         * (so it can't be depedent of any equal sized ring seen so far,
         * so URF relation is out of discussion)
         */
        oldBasisCyclesSize = currentBasisCyclesSize;
        compressedBasisCycles[currentBasisCyclesSize] = compressedCycleWithEqualAdded;
        ++currentBasisCyclesSize;

        /*
         * this is where the magic is happening: ensure that the basis is
         * indeed in row echelon form (we use the property throughout the algorithm)
         *
         * swap columns such that indeed the current ring with index currentBasisCycleSize-1
         * has a 1 at column currentBasisCycleSize-1
         * => ROW ECHELON FORM
         *
         * [this corresponds to the "swap columns operation" of gaussian elimination]
         */
        if (!RDL_bitset_test(compressedCycleWithEqualAdded, oldBasisCyclesSize)) {
          for (k = oldBasisCyclesSize + 1; k < graph->E; ++k) {
            if (RDL_bitset_test(compressedCycleWithEqualAdded, k)) {
              RDL_swap_columns(compressedBasisCycles, currentBasisCyclesSize, oldBasisCyclesSize, k);
              RDL_swap_columns(compressedRelevantCycles, currentRelevantCyclesSize, oldBasisCyclesSize, k);
              RDL_swap_columns(compressedPrototypesForGaussian, RCFs->nofFams, oldBasisCyclesSize, k);
              break;
            }
          }
        }
      }

    }
  }

  for (i = 0; i < currentBasisCyclesSize; ++i) {
    free(compressedBasisCycles[i]);
  }
  free(compressedBasisCycles);

  for (i = 0; i < currentRelevantCyclesSize; ++i) {
    free(compressedRelevantCycles[i]);
  }
  free(compressedRelevantCycles);
  free(relevantCyclesMap);

  for (i = 0; i < RCFs->nofFams; ++i) {
    free(compressedPrototypesForGaussian[i]);
  }
  free(compressedPrototypesForGaussian);
  free((void*)empty_cycle);
}